

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_dup_mem_arm
               (TCGContext_conflict *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz)

{
  TCGOpcode opc;
  TCGType_conflict type;
  TCGv_vec pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i32 ret;
  uintptr_t o;
  ulong uVar3;
  uint32_t uVar4;
  uintptr_t o_1;
  
  if (3 < vece) {
    if (have_avx1_arm) {
      pTVar1 = tcg_temp_new_vec_arm(tcg_ctx,TCG_TYPE_V128);
      tcg_gen_ld_vec_arm(tcg_ctx,pTVar1,tcg_ctx->cpu_env,(ulong)aofs);
      for (uVar3 = 0; uVar3 < oprsz; uVar3 = uVar3 + 0x10) {
        tcg_gen_st_vec_arm(tcg_ctx,pTVar1,tcg_ctx->cpu_env,(ulong)(dofs + (int)uVar3));
      }
    }
    else {
      pTVar2 = tcg_temp_new_i64(tcg_ctx);
      pTVar1 = (TCGv_vec)tcg_temp_new_i64(tcg_ctx);
      tcg_gen_ld_i64_arm(tcg_ctx,pTVar2,tcg_ctx->cpu_env,(ulong)aofs);
      tcg_gen_ld_i64_arm(tcg_ctx,(TCGv_i64)pTVar1,tcg_ctx->cpu_env,(ulong)(aofs + 8));
      uVar4 = dofs;
      for (uVar3 = 0; uVar3 < oprsz; uVar3 = uVar3 + 0x10) {
        tcg_gen_st_i64_arm(tcg_ctx,pTVar2,tcg_ctx->cpu_env,(ulong)uVar4);
        tcg_gen_st_i64_arm(tcg_ctx,(TCGv_i64)pTVar1,tcg_ctx->cpu_env,(ulong)(uVar4 + 8));
        uVar4 = uVar4 + 0x10;
      }
      tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    }
    tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    if (oprsz <= maxsz && maxsz - oprsz != 0) {
      expand_clr(tcg_ctx,oprsz + dofs,maxsz - oprsz);
      return;
    }
    return;
  }
  type = choose_vector_type(tcg_ctx,(TCGOpcode *)0x0,vece,oprsz,false);
  if (type != TCG_TYPE_I32) {
    pTVar1 = tcg_temp_new_vec_arm(tcg_ctx,type);
    tcg_gen_dup_mem_vec_arm(tcg_ctx,vece,pTVar1,tcg_ctx->cpu_env,(ulong)aofs);
    do_dup_store(tcg_ctx,type,dofs,oprsz,maxsz,pTVar1);
    goto LAB_005713da;
  }
  uVar3 = (ulong)aofs;
  if (vece == 3) {
    pTVar2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ld_i64_arm(tcg_ctx,pTVar2,tcg_ctx->cpu_env,uVar3);
    vece = 3;
    ret = (TCGv_i32)0x0;
    pTVar1 = (TCGv_vec)pTVar2;
  }
  else {
    ret = tcg_temp_new_i32(tcg_ctx);
    if (vece == 1) {
      opc = INDEX_op_ld16u_i32;
LAB_00571393:
      tcg_gen_op3_arm(tcg_ctx,opc,(TCGArg)(ret + (long)&tcg_ctx->pool_cur),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),uVar3);
    }
    else {
      if (vece == 0) {
        opc = INDEX_op_ld8u_i32;
        goto LAB_00571393;
      }
      tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,uVar3);
    }
    pTVar2 = (TCGv_i64)0x0;
    pTVar1 = (TCGv_vec)ret;
  }
  do_dup(tcg_ctx,vece,dofs,oprsz,maxsz,ret,pTVar2,0);
LAB_005713da:
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_dup_mem(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                          uint32_t oprsz, uint32_t maxsz)
{
    check_size_align(oprsz, maxsz, dofs);
    if (vece <= MO_64) {
        TCGType type = choose_vector_type(tcg_ctx, NULL, vece, oprsz, 0);
        if (type != 0) {
            TCGv_vec t_vec = tcg_temp_new_vec(tcg_ctx, type);
            tcg_gen_dup_mem_vec(tcg_ctx, vece, t_vec, tcg_ctx->cpu_env, aofs);
            do_dup_store(tcg_ctx, type, dofs, oprsz, maxsz, t_vec);
            tcg_temp_free_vec(tcg_ctx, t_vec);
        } else if (vece <= MO_32) {
            TCGv_i32 in = tcg_temp_new_i32(tcg_ctx);
            switch (vece) {
            case MO_8:
                tcg_gen_ld8u_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            case MO_16:
                tcg_gen_ld16u_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            default:
                tcg_gen_ld_i32(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
                break;
            }
            do_dup(tcg_ctx, vece, dofs, oprsz, maxsz, in, NULL, 0);
            tcg_temp_free_i32(tcg_ctx, in);
        } else {
            TCGv_i64 in = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_ld_i64(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
            do_dup(tcg_ctx, vece, dofs, oprsz, maxsz, NULL, in, 0);
            tcg_temp_free_i64(tcg_ctx, in);
        }
    } else {
        /* 128-bit duplicate.  */
        /* ??? Dup to 256-bit vector.  */
        int i;

        tcg_debug_assert(vece == 4);
        tcg_debug_assert(oprsz >= 16);
        if (TCG_TARGET_HAS_v128) {
            TCGv_vec in = tcg_temp_new_vec(tcg_ctx, TCG_TYPE_V128);

            tcg_gen_ld_vec(tcg_ctx, in, tcg_ctx->cpu_env, aofs);
            for (i = 0; i < oprsz; i += 16) {
                tcg_gen_st_vec(tcg_ctx, in, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_vec(tcg_ctx, in);
        } else {
            TCGv_i64 in0 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 in1 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ld_i64(tcg_ctx, in0, tcg_ctx->cpu_env, aofs);
            tcg_gen_ld_i64(tcg_ctx, in1, tcg_ctx->cpu_env, aofs + 8);
            for (i = 0; i < oprsz; i += 16) {
                tcg_gen_st_i64(tcg_ctx, in0, tcg_ctx->cpu_env, dofs + i);
                tcg_gen_st_i64(tcg_ctx, in1, tcg_ctx->cpu_env, dofs + i + 8);
            }
            tcg_temp_free_i64(tcg_ctx, in0);
            tcg_temp_free_i64(tcg_ctx, in1);
        }
        if (oprsz < maxsz) {
            expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
        }
    }
}